

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

void vkt::SpirVAssembly::(anonymous_namespace)::fillRandomScalars<int,bool(*)(long)>
               (Random *rnd,int minValue,int maxValue,void *dst,int numValues,
               _func_bool_long *filter,int offset)

{
  deUint32 dVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    do {
      dVar1 = deRandom_getUint32(&rnd->m_rnd);
      if (maxValue != 0x7fffffff || minValue != -0x80000000) {
        dVar1 = dVar1 % ((maxValue - minValue) + 1U) + minValue;
      }
    } while (dVar1 == 0);
    *(deUint32 *)((long)dst + lVar2 * 4) = dVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 200);
  return;
}

Assistant:

static void fillRandomScalars (de::Random& rnd, T minValue, T maxValue, void* dst, int numValues, FilterT filter, int offset = 0)
{
	T* const typedPtr = (T*)dst;
	T value;
	for (int ndx = 0; ndx < numValues; ndx++)
	{
		do
			value = randomScalar<T>(rnd, minValue, maxValue);
		while (!filter(value));

		typedPtr[offset + ndx] = value;
	}
}